

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  GLint *data;
  FramebufferType width;
  ChannelOrder CVar1;
  ChannelType CVar2;
  RenderContext *renderCtx;
  ChannelOrder CVar3;
  float fVar4;
  bool bVar5;
  GLenum GVar6;
  int iVar7;
  deUint32 dVar8;
  GLuint index;
  int iVar9;
  FramebufferType FVar10;
  GLfloat GVar11;
  GLfloat GVar12;
  char *pcVar13;
  MessageBuilder *pMVar14;
  RenderTarget *pRVar15;
  TestError *this_00;
  byte bVar16;
  char *pcVar17;
  int iVar18;
  int y;
  int y_00;
  int x;
  int x_00;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  GLuint renderbuffer;
  GLfloat local_448;
  GLuint framebuffer;
  float local_440;
  allocator<char> local_439;
  Random rnd;
  TextureFormat format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  IVec4 formatBitDepths;
  Texture2D reference;
  GLfloat color [4];
  ConstPixelBufferAccess *local_368;
  GLuint local_2f0;
  bool local_2c8;
  string local_2b0;
  stringstream fragmentSource;
  float fStack_28c;
  float local_288;
  float local_284;
  undefined1 local_280 [376];
  ConstPixelBufferAccess resultAccess;
  
  format.order = RGBA;
  format.type = UNORM_INT8;
  if ((char)(this->m_random).m_rnd.y == '\x01') {
    glwGetIntegerv(0x8b9b,(GLint *)&this->m_program);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_FORMAT, &m_format)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xd0);
    data = (GLint *)((long)&this->m_program + 4);
    glwGetIntegerv(0x8b9a,data);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_TYPE, &m_type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xd1);
    if ((1 < *(int *)&this->m_program - 0x1907U) && (*(int *)&this->m_program != 0x80e1)) {
      auVar21 = __cxa_allocate_exception(0x38);
      resultAccess.m_format = (TextureFormat)glu::getTextureFormatName;
      resultAccess.m_size.m_data[0] = *(int *)&this->m_program;
      de::toString<tcu::Format::Enum<int,2ul>>((string *)color,(de *)&resultAccess,auVar21._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentSource,"Unsupported IMPLEMENTATION_COLOR_READ_FORMAT: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)color);
      tcu::NotSupportedError::NotSupportedError
                (auVar21._0_8_,(char *)_fragmentSource,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                 ,0xd4);
      __cxa_throw(auVar21._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar13 = glu::getTypeName(*data);
    if (pcVar13 == (char *)0x0) {
      auVar21 = __cxa_allocate_exception(0x38);
      resultAccess.m_format = (TextureFormat)(long)*data;
      de::toString<tcu::Format::Hex<4ul>>((string *)color,(de *)&resultAccess,auVar21._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentSource,"Unsupported GL_IMPLEMENTATION_COLOR_READ_TYPE: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)color);
      tcu::NotSupportedError::NotSupportedError
                (auVar21._0_8_,(char *)_fragmentSource,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                 ,0xd6);
      __cxa_throw(auVar21._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  format = glu::mapGLTransferFormat
                     (*(deUint32 *)&this->m_program,*(deUint32 *)((long)&this->m_program + 4));
  iVar7 = tcu::TextureFormat::getPixelSize(&format);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"Format: ");
  color[2] = *(GLfloat *)&this->m_program;
  color._0_8_ = glu::getTextureFormatName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)color,(ostream *)&local_288);
  std::operator<<((ostream *)&local_288,", Type: ");
  resultAccess.m_format = (TextureFormat)glu::getTypeName;
  resultAccess.m_size.m_data[0] = *(int *)((long)&this->m_program + 4);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&resultAccess,(ostream *)&local_288);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragmentSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  tcu::Texture2D::Texture2D(&reference,&format,this->m_framebuffeType,this->m_renderbufferFormat);
  tcu::Texture2D::allocLevel(&reference,0);
  glwPixelStorei(0xd05,(this->m_random).m_rnd.z);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x152);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"GL_PACK_ALIGNMENT: ");
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&fragmentSource,(int *)&(this->m_random).m_rnd.z);
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  glwPixelStorei(0xd02,(this->m_random).m_rnd.w);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glPixelStorei(GL_PACK_ROW_LENGTH, m_rowLength)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x155);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"GL_PACK_ROW_LENGTH: ");
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&fragmentSource,(int *)&(this->m_random).m_rnd.w);
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  glwPixelStorei(0xd03,*(GLint *)&this->m_log);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glPixelStorei(GL_PACK_SKIP_ROWS, m_skipRows)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x158);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"GL_PACK_SKIP_ROWS: ");
  pMVar14 = tcu::MessageBuilder::operator<<((MessageBuilder *)&fragmentSource,(int *)&this->m_log);
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  glwPixelStorei(0xd04,*(GLint *)((long)&this->m_log + 4));
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glPixelStorei(GL_PACK_SKIP_PIXELS, m_skipPixels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x15b);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"GL_PACK_SKIP_PIXELS: ");
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&fragmentSource,(int *)((long)&this->m_log + 4));
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  glwViewport(0,0,this->m_framebuffeType,this->m_renderbufferFormat);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glViewport(0, 0, m_width, m_height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x15e);
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,(this->m_random).m_rnd.x);
  framebuffer = 0;
  renderbuffer = 0;
  if (*(char *)((long)&(this->m_random).m_rnd.y + 1) == '\x01') {
    iVar18 = *(int *)((long)&this->m_program + 4);
    if (iVar18 == 0x1404) {
      glwGenRenderbuffers(1,&renderbuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glGenRenderbuffers(1, &renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xed);
      glwBindRenderbuffer(0x8d41,renderbuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xee);
      glwRenderbufferStorage(0x8d41,0x8d82,this->m_framebuffeType,this->m_renderbufferFormat);
      dVar8 = glwGetError();
      iVar18 = 0xef;
      pcVar13 = "glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32I, m_width, m_height)";
LAB_010bba1f:
      glu::checkError(dVar8,pcVar13,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,iVar18);
    }
    else if (iVar18 == 0x1405) {
      glwGenRenderbuffers(1,&renderbuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glGenRenderbuffers(1, &renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xe7);
      glwBindRenderbuffer(0x8d41,renderbuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0xe8);
      glwRenderbufferStorage(0x8d41,0x8d70,this->m_framebuffeType,this->m_renderbufferFormat);
      dVar8 = glwGetError();
      iVar18 = 0xe9;
      pcVar13 = "glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA32UI, m_width, m_height)";
      goto LAB_010bba1f;
    }
    glwBindRenderbuffer(0x8d41,0);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glBindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf4);
    glwGenFramebuffers(1,&framebuffer);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glGenFramebuffers(1, &framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf5);
    glwBindFramebuffer(0x8d40,framebuffer);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glBindFramebuffer(GL_FRAMEBUFFER, framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf6);
    glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,renderbuffer);
    GVar6 = glwGetError();
    glu::checkError(GVar6,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xf7);
  }
  glwViewport(0,0,reference.m_width,reference.m_height);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glViewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x100);
  iVar18 = *(int *)&this->m_program;
  if (1 < iVar18 - 0x1907U) {
    if (iVar18 == 0x8d99) {
      iVar18 = *(int *)((long)&this->m_program + 4);
      if (iVar18 == 0x1405) {
        GVar11 = (GLfloat)deRandom_getUint32(&rnd.m_rnd);
        GVar12 = (GLfloat)deRandom_getUint32(&rnd.m_rnd);
        fVar19 = (float)deRandom_getUint32(&rnd.m_rnd);
        fVar20 = (float)deRandom_getUint32(&rnd.m_rnd);
        color[1] = GVar12;
        color[0] = GVar11;
        _fragmentSource =
             (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        color[2] = fVar19;
        color[3] = fVar20;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
        std::operator<<((ostream *)&local_288,"ClearColor: (");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
        std::operator<<((ostream *)&local_288,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
        std::operator<<((ostream *)&local_288,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_288);
        std::operator<<((ostream *)&local_288,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&fragmentSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
        glwClearBufferuiv(0x1800,0,(GLuint *)color);
        GVar6 = glwGetError();
        glu::checkError(GVar6,"glClearBufferuiv(GL_COLOR, 0, color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                        ,0x12d);
        fStack_28c = GVar12;
        _fragmentSource = (ChannelOrder)GVar11;
        local_288 = fVar19;
        local_284 = fVar20;
        tcu::clear(reference.super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,(UVec4 *)&fragmentSource);
      }
      else if (iVar18 == 0x1404) {
        GVar11 = (GLfloat)deRandom_getUint32(&rnd.m_rnd);
        GVar12 = (GLfloat)deRandom_getUint32(&rnd.m_rnd);
        fVar19 = (float)deRandom_getUint32(&rnd.m_rnd);
        fVar20 = (float)deRandom_getUint32(&rnd.m_rnd);
        color[1] = GVar12;
        color[0] = GVar11;
        _fragmentSource =
             (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        color[2] = fVar19;
        color[3] = fVar20;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
        std::operator<<((ostream *)&local_288,"ClearColor: (");
        std::ostream::operator<<((ostringstream *)&local_288,(int)GVar11);
        std::operator<<((ostream *)&local_288,", ");
        std::ostream::operator<<((ostringstream *)&local_288,(int)GVar12);
        std::operator<<((ostream *)&local_288,", ");
        std::ostream::operator<<((ostringstream *)&local_288,(int)fVar19);
        std::operator<<((ostream *)&local_288,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&fragmentSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
        glwClearBufferiv(0x1800,0,(GLint *)color);
        GVar6 = glwGetError();
        glu::checkError(GVar6,"glClearBufferiv(GL_COLOR, 0, color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                        ,0x11f);
        fStack_28c = GVar12;
        _fragmentSource = (ChannelOrder)GVar11;
        local_288 = fVar19;
        local_284 = fVar20;
        tcu::clear(reference.super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,(IVec4 *)&fragmentSource);
      }
      goto LAB_010bbcf8;
    }
    if (iVar18 != 0x80e1) goto LAB_010bbcf8;
  }
  fVar19 = deRandom_getFloat(&rnd.m_rnd);
  fVar20 = deRandom_getFloat(&rnd.m_rnd);
  local_448 = deRandom_getFloat(&rnd.m_rnd);
  local_440 = deRandom_getFloat(&rnd.m_rnd);
  color[1] = fVar20;
  color[0] = fVar19;
  color[2] = local_448;
  color[3] = local_440;
  glwClearColor(fVar19,fVar20,local_448,local_440);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glClearColor(red, green, blue, alpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x10c);
  _fragmentSource =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::operator<<((ostream *)&local_288,"ClearColor: (");
  std::ostream::operator<<((ostringstream *)&local_288,fVar19);
  std::operator<<((ostream *)&local_288,", ");
  std::ostream::operator<<((ostringstream *)&local_288,fVar20);
  std::operator<<((ostream *)&local_288,", ");
  std::ostream::operator<<((ostringstream *)&local_288,local_448);
  std::operator<<((ostream *)&local_288,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragmentSource,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
  glwClearBufferfv(0x1800,0,color);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glClearBufferfv(GL_COLOR, 0, color)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                  ,0x10f);
  fStack_28c = fVar20;
  _fragmentSource = (ChannelOrder)fVar19;
  local_288 = local_448;
  local_284 = local_440;
  tcu::clear(reference.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&fragmentSource);
LAB_010bbcf8:
  std::__cxx11::stringstream::stringstream((stringstream *)&fragmentSource);
  std::operator<<((ostream *)local_280,"#version 300 es\n");
  pcVar13 = "layout(location = 0) out mediump vec4 o_color;\n";
  if (reference.super_TextureLevelPyramid.m_format.type == UNSIGNED_INT32) {
    pcVar13 = "layout(location = 0) out mediump uvec4 o_color;\n";
  }
  pcVar17 = "layout(location = 0) out mediump ivec4 o_color;\n";
  if (reference.super_TextureLevelPyramid.m_format.type != SIGNED_INT32) {
    pcVar17 = pcVar13;
  }
  std::operator<<((ostream *)local_280,pcVar17);
  std::operator<<((ostream *)local_280,"void main (void)\n{\n");
  pcVar13 = "\to_color = vec4(0.0, 0.0, 0.0, 1.0);\n";
  if (reference.super_TextureLevelPyramid.m_format.type == SIGNED_INT32) {
    pcVar13 = "\to_color = ivec4(0, 0, 0, 1000);\n";
  }
  pcVar17 = "\to_color = uvec4(0, 0, 0, 1000);\n";
  if (reference.super_TextureLevelPyramid.m_format.type != UNSIGNED_INT32) {
    pcVar17 = pcVar13;
  }
  std::operator<<((ostream *)local_280,pcVar17);
  std::operator<<((ostream *)local_280,"}\n");
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&formatBitDepths,
             "#version 300 es\nin mediump vec2 i_coord;\nvoid main (void)\n{\n\tgl_Position = vec4(i_coord, 0.0, 1.0);\n}\n"
             ,&local_439);
  std::__cxx11::stringbuf::str();
  glu::makeVtxFragSources((ProgramSources *)&resultAccess,(string *)&formatBitDepths,&local_2b0);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)color,renderCtx,(ProgramSources *)&resultAccess);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&resultAccess);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&formatBitDepths);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)color);
  if (local_2c8 != false) {
    glwUseProgram(local_2f0);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x96);
    resultAccess.m_data = (void *)0x3f000000bf000000;
    resultAccess._16_8_ = &DAT_3f0000003f000000;
    resultAccess.m_pitch.m_data._4_8_ = &DAT_3f0000003f000000;
    resultAccess.m_format.order = 0xbf000000;
    resultAccess.m_format.type = 0xbf000000;
    resultAccess.m_size.m_data[0] = 0x3f000000;
    resultAccess.m_size.m_data[1] = -0x41000000;
    index = glwGetAttribLocation(local_2f0,"i_coord");
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xa7);
    glwEnableVertexAttribArray(index);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glEnableVertexAttribArray(coordLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xa9);
    glwVertexAttribPointer(index,2,0x1406,'\0',0,&resultAccess);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xab);
    glwDrawArrays(4,0,6);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glDrawArrays(GL_TRIANGLES, 0, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xad);
    glwDisableVertexAttribArray(index);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glDisableVertexAttribArray(coordLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0xae);
    fVar19 = (float)reference.m_width * 0.5;
    fVar20 = (float)reference.m_height * 0.5;
    iVar18 = reference.m_width;
    iVar9 = reference.m_height;
    for (x_00 = 0; x_00 < iVar18; x_00 = x_00 + 1) {
      if (((int)(fVar19 - fVar19 * 0.5) <= x_00) && (x_00 <= (int)(fVar19 * 0.5 + fVar19))) {
        for (y_00 = 0; iVar18 = reference.m_width, y_00 < iVar9; y_00 = y_00 + 1) {
          if (((int)(fVar20 - fVar20 * 0.5) <= y_00) && (y_00 <= (int)(fVar20 * 0.5 + fVar20))) {
            if (reference.super_TextureLevelPyramid.m_format.type == UNSIGNED_INT32) {
              resultAccess.m_format.order = R;
              resultAccess.m_format.type = SNORM_INT8;
              resultAccess.m_size.m_data[0] = 0;
              resultAccess.m_size.m_data[1] = 1000;
              tcu::PixelBufferAccess::setPixel
                        (reference.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(UVec4 *)&resultAccess,x_00,y_00,
                         0);
            }
            else if (reference.super_TextureLevelPyramid.m_format.type == SIGNED_INT32) {
              resultAccess.m_format.order = R;
              resultAccess.m_format.type = SNORM_INT8;
              resultAccess.m_size.m_data[0] = 0;
              resultAccess.m_size.m_data[1] = 1000;
              tcu::PixelBufferAccess::setPixel
                        (reference.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(IVec4 *)&resultAccess,x_00,y_00,
                         0);
            }
            else {
              resultAccess.m_format.order = R;
              resultAccess.m_format.type = SNORM_INT8;
              resultAccess.m_size.m_data[0] = 0;
              resultAccess.m_size.m_data[1] = 0x3f800000;
              tcu::PixelBufferAccess::setPixel
                        (reference.super_TextureLevelPyramid.m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&resultAccess,x_00,y_00,0
                        );
            }
          }
          iVar9 = reference.m_height;
        }
      }
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)color);
    std::__cxx11::stringstream::~stringstream((stringstream *)&fragmentSource);
    dVar8 = (this->m_random).m_rnd.z;
    FVar10 = (this->m_random).m_rnd.w;
    if (FVar10 == FRAMEBUFFERTYPE_NATIVE) {
      FVar10 = this->m_framebuffeType;
    }
    fVar19 = ceilf((float)(int)((FVar10 + *(int *)((long)&this->m_log + 4)) * iVar7) /
                   (float)(int)dVar8);
    _fragmentSource = (TextureFormat)((ulong)_fragmentSource & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pixelData,
               (long)(int)((*(int *)&this->m_log + this->m_renderbufferFormat) * dVar8 * (int)fVar19
                          ),(value_type_conflict5 *)&fragmentSource);
    glwReadPixels(0,0,this->m_framebuffeType,this->m_renderbufferFormat,*(GLenum *)&this->m_program,
                  *(GLenum *)((long)&this->m_program + 4),
                  pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start);
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glReadPixels(0, 0, m_width, m_height, m_format, m_type, &(pixelData[0]))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                    ,0x13e);
    if (framebuffer != 0) {
      glwDeleteFramebuffers(1,&framebuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glDeleteFramebuffers(1, &framebuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0x141);
    }
    if (renderbuffer != 0) {
      glwDeleteRenderbuffers(1,&renderbuffer);
      GVar6 = glwGetError();
      glu::checkError(GVar6,"glDeleteRenderbuffers(1, &renderbuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
                      ,0x144);
    }
    dVar8 = (this->m_random).m_rnd.z;
    FVar10 = (this->m_random).m_rnd.w;
    width = this->m_framebuffeType;
    if (FVar10 == FRAMEBUFFERTYPE_NATIVE) {
      FVar10 = width;
    }
    fVar19 = ceilf((float)(int)(FVar10 * iVar7) / (float)(int)dVar8);
    iVar18 = (int)fVar19 * dVar8;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&resultAccess,&format,width,this->m_renderbufferFormat,1,iVar18,0,
               pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               (*(int *)&this->m_log * iVar18 + *(int *)((long)&this->m_log + 4) * iVar7));
    if ((*(char *)((long)&(this->m_random).m_rnd.y + 1) == '\0') &&
       (pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context),
       1 < pRVar15->m_numSamples)) {
      tcu::getTextureFormatBitDepth((tcu *)&formatBitDepths,&format);
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar7 = (pRVar15->m_pixelFormat).redBits;
      if (iVar7 < formatBitDepths.m_data[0]) {
        formatBitDepths.m_data[0] = iVar7;
      }
      fVar19 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[0] & 0x1f))) * 256.0);
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar7 = (pRVar15->m_pixelFormat).greenBits;
      if (iVar7 < formatBitDepths.m_data[1]) {
        formatBitDepths.m_data[1] = iVar7;
      }
      fVar20 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[1] & 0x1f))) * 256.0);
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar7 = (pRVar15->m_pixelFormat).blueBits;
      if (iVar7 < formatBitDepths.m_data[2]) {
        formatBitDepths.m_data[2] = iVar7;
      }
      local_448 = ceilf((2.0 / (float)(1 << ((byte)formatBitDepths.m_data[2] & 0x1f))) * 256.0);
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar7 = (pRVar15->m_pixelFormat).alphaBits;
      bVar16 = (byte)formatBitDepths.m_data[3];
      if (iVar7 < formatBitDepths.m_data[3]) {
        bVar16 = (byte)iVar7;
      }
      local_440 = ceilf((2.0 / (float)(1 << (bVar16 & 0x1f))) * 256.0);
      color[0] = 1.12104e-44;
      color[1] = 4.2039e-45;
      tcu::Texture2D::Texture2D
                ((Texture2D *)&fragmentSource,(TextureFormat *)color,this->m_framebuffeType,
                 this->m_renderbufferFormat);
      local_2b0._M_dataplus._M_p = (pointer)0x300000008;
      tcu::Texture2D::Texture2D
                ((Texture2D *)color,(TextureFormat *)&local_2b0,this->m_framebuffeType,
                 this->m_renderbufferFormat);
      tcu::Texture2D::allocLevel((Texture2D *)&fragmentSource,0);
      tcu::Texture2D::allocLevel((Texture2D *)color,0);
      tcu::copy((EVP_PKEY_CTX *)local_280._16_8_,
                (EVP_PKEY_CTX *)
                reference.super_TextureLevelPyramid.m_access.
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start);
      tcu::copy((EVP_PKEY_CTX *)local_368,(EVP_PKEY_CTX *)&resultAccess);
      bVar5 = tcu::bilinearCompare
                        (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         "Result","Result",(ConstPixelBufferAccess *)local_280._16_8_,local_368,
                         (RGBA)(((int)local_448 & 0xffU) << 0x10 |
                                ((int)fVar20 & 0xffU) << 8 | (int)fVar19 & 0xffU |
                               (int)local_440 << 0x18),COMPARE_LOG_RESULT);
      pcVar13 = "Fail";
      if (bVar5) {
        pcVar13 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,pcVar13
                );
      tcu::Texture3D::~Texture3D((Texture3D *)color);
      tcu::Texture3D::~Texture3D((Texture3D *)&fragmentSource);
    }
    else {
      tcu::getTextureFormatBitDepth((tcu *)&fragmentSource,&format);
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      CVar1 = (pRVar15->m_pixelFormat).redBits;
      CVar3 = _fragmentSource;
      if ((int)CVar1 < (int)_fragmentSource) {
        CVar3 = CVar1;
      }
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      CVar2 = (pRVar15->m_pixelFormat).greenBits;
      fVar19 = fStack_28c;
      if ((int)CVar2 < (int)fStack_28c) {
        fVar19 = (float)CVar2;
      }
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      fVar4 = local_288;
      fVar20 = (float)(pRVar15->m_pixelFormat).blueBits;
      pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
      if ((int)fVar20 < (int)fVar4) {
        fVar4 = fVar20;
      }
      color[2] = 2.0 / (float)(1 << (SUB41(fVar4,0) & 0x1f));
      iVar7 = (pRVar15->m_pixelFormat).alphaBits;
      bVar16 = SUB41(local_284,0);
      if (iVar7 < (int)local_284) {
        bVar16 = (byte)iVar7;
      }
      color[3] = 2.0 / (float)(1 << (bVar16 & 0x1f));
      color[1] = 2.0 / (float)(1 << (SUB41(fVar19,0) & 0x1f));
      color[0] = 2.0 / (float)(1 << ((byte)CVar3 & 0x1f));
      bVar5 = tcu::floatThresholdCompare
                        (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         "Result","Result",
                         &(reference.super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                         &resultAccess,(Vec4 *)color,COMPARE_LOG_RESULT);
      pcVar13 = "Fail";
      if (bVar5) {
        pcVar13 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,pcVar13
                );
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pixelData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    tcu::Texture3D::~Texture3D((Texture3D *)&reference);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fReadPixelsTests.cpp"
             ,0x95);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate(void)
{
	int width				= m_context.getRenderTarget().getWidth();
	int height				= m_context.getRenderTarget().getHeight();

	GLuint framebuffer	= 0;
	GLuint renderbuffer	= 0;

	switch (m_framebuffeType)
	{
		case TestSpec::FRAMEBUFFERTYPE_NATIVE:
			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			break;

		case TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER:
		{
			GLU_CHECK_CALL(glGenFramebuffers(1, &framebuffer));
			GLU_CHECK_CALL(glGenRenderbuffers(1, &renderbuffer));

			GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer));
			GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, m_renderbufferFormat, width, height));

			GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, framebuffer));
			GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer));

			break;
		}

		default:
			DE_ASSERT(false);
	}

	clearColor(m_colorScale * 0.4f, m_colorScale * 1.0f, m_colorScale * 0.5f, m_colorScale * 1.0f);

	if (m_useColorClears)
	{
		const int maxClearCount	= 10;
		const int minClearCount	= 6;
		const int minClearSize	= 15;

		int clearCount = m_random.getInt(minClearCount, maxClearCount);

		for (int clearNdx = 0; clearNdx < clearCount; clearNdx++)
		{
			int clearX = m_random.getInt(0, width - minClearSize);
			int clearY = m_random.getInt(0, height - minClearSize);

			int clearWidth = m_random.getInt(minClearSize, width - clearX);
			int clearHeight = m_random.getInt(minClearSize, height - clearY);

			float clearRed		= m_colorScale * m_random.getFloat();
			float clearGreen	= m_colorScale * m_random.getFloat();
			float clearBlue		= m_colorScale * m_random.getFloat();
			float clearAlpha	= m_colorScale * (0.5f + 0.5f * m_random.getFloat());

			GLU_CHECK_CALL(glEnable(GL_SCISSOR_TEST));
			GLU_CHECK_CALL(glScissor(clearX, clearY, clearWidth, clearHeight));

			clearColor(clearRed, clearGreen, clearBlue, clearAlpha);
		}

		GLU_CHECK_CALL(glDisable(GL_SCISSOR_TEST));
	}

	if (m_renderTriangles)
	{
		const int minTriangleCount = 4;
		const int maxTriangleCount = 10;

		int triangleCount = m_random.getInt(minTriangleCount, maxTriangleCount);

		for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
		{
			float x1 = 2.0f * m_random.getFloat() - 1.0f;
			float y1 = 2.0f * m_random.getFloat() - 1.0f;
			float z1 = 2.0f * m_random.getFloat() - 1.0f;

			float x2 = 2.0f * m_random.getFloat() - 1.0f;
			float y2 = 2.0f * m_random.getFloat() - 1.0f;
			float z2 = 2.0f * m_random.getFloat() - 1.0f;

			float x3 = 2.0f * m_random.getFloat() - 1.0f;
			float y3 = 2.0f * m_random.getFloat() - 1.0f;
			float z3 = 2.0f * m_random.getFloat() - 1.0f;

			renderTriangle(tcu::Vec3(x1, y1, z1), tcu::Vec3(x2, y2, z2), tcu::Vec3(x3, y3, z3));
		}
	}

	tcu::TextureFormat	readFormat;
	GLenum				readPixelsFormat;
	GLenum				readPixelsType;
	bool				floatCompare;


	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
	{
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_UNSIGNED_BYTE;
		floatCompare		= false;
	}
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_UNSIGNED_BYTE;
				floatCompare		= true;
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA_INTEGER, GL_UNSIGNED_INT);
				readPixelsFormat	= GL_RGBA_INTEGER;
				readPixelsType		= GL_UNSIGNED_INT;
				floatCompare		= false;
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
				break;

			default:
				DE_ASSERT(false);
				// Silence warnings
				readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
				readPixelsFormat	= GL_RGBA;
				readPixelsType		= GL_FLOAT;
				floatCompare		= true;
		}
	}
	else
	{
		// Silence warnings
		readFormat			= glu::mapGLTransferFormat(GL_RGBA, GL_FLOAT);
		readPixelsFormat	= GL_RGBA;
		readPixelsType		= GL_FLOAT;
		floatCompare		= true;
		DE_ASSERT(false);
	}

	tcu::Texture2D	readRefrence	(readFormat, width, height);
	const int		readDataSize	= readRefrence.getWidth() * readRefrence.getHeight() * readFormat.getPixelSize();

	readRefrence.allocLevel(0);

	GLuint pixelBuffer = (GLuint)-1;

	GLU_CHECK_CALL(glGenBuffers(1, &pixelBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glBufferData(GL_PIXEL_PACK_BUFFER, readDataSize, NULL, GL_STREAM_READ));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, 0));

	const deUint8* bufferData = (const deUint8*)glMapBufferRange(GL_PIXEL_PACK_BUFFER, 0, readDataSize, GL_MAP_READ_BIT);
	GLU_CHECK_MSG("glMapBufferRange() failed");

	tcu::ConstPixelBufferAccess readResult(readFormat, width, height, 1, bufferData);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, 0));

	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, readPixelsFormat, readPixelsType, readRefrence.getLevel(0).getDataPtr()));

	if (framebuffer)
		GLU_CHECK_CALL(glDeleteFramebuffers(1, &framebuffer));

	if (renderbuffer)
		GLU_CHECK_CALL(glDeleteRenderbuffers(1, &renderbuffer));


	bool isOk = false;

	if (floatCompare)
		isOk = tcu::floatThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::COMPARE_LOG_RESULT);
	else
		isOk = tcu::intThresholdCompare(m_log, "Result comparision", "Result of read pixels to memory compared with result of read pixels to buffer", readRefrence.getLevel(0), readResult, tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	GLU_CHECK_CALL(glBindBuffer(GL_PIXEL_PACK_BUFFER, pixelBuffer));
	GLU_CHECK_CALL(glUnmapBuffer(GL_PIXEL_PACK_BUFFER));
	GLU_CHECK_CALL(glDeleteBuffers(1, &pixelBuffer));

	if (isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
}